

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O0

void __thiscall QTextBrowserPrivate::QTextBrowserPrivate(QTextBrowserPrivate *this)

{
  QTextEditPrivate *in_RDI;
  array<QMetaObject::Connection,_3UL> *unaff_retaddr;
  
  QTextEditPrivate::QTextEditPrivate(in_RDI);
  *(undefined ***)
   &(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate =
       &PTR__QTextBrowserPrivate_00d1e4a8;
  QStack<QTextBrowserPrivate::HistoryEntry>::QStack
            ((QStack<QTextBrowserPrivate::HistoryEntry> *)0x6e0f3b);
  QStack<QTextBrowserPrivate::HistoryEntry>::QStack
            ((QStack<QTextBrowserPrivate::HistoryEntry> *)0x6e0f4c);
  QUrl::QUrl((QUrl *)&in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                      super_QWidgetPrivate.field_0x30);
  QUrl::QUrl((QUrl *)&in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                      super_QWidgetPrivate.field_0x38);
  QList<QString>::QList((QList<QString> *)0x6e0f7f);
  in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x58 = 0
  ;
  in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x59 = 0
  ;
  in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x5a = 0
  ;
  in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x5b = 1
  ;
  QCursor::QCursor((QCursor *)
                   &in_RDI[1].super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                    super_QWidgetPrivate.field_0x60);
  std::array<QMetaObject::Connection,_3UL>::array(unaff_retaddr);
  return;
}

Assistant:

inline QTextBrowserPrivate()
        : textOrSourceChanged(false), forceLoadOnSourceChange(false), openExternalLinks(false),
          openLinks(true)
#ifdef QT_KEYPAD_NAVIGATION
        , lastKeypadScrollValue(-1)
#endif
    {}